

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::String(String *this,String *other)

{
  char *pcVar1;
  usize uVar2;
  ulong uVar3;
  Data *pDVar4;
  usize capacity;
  String *other_local;
  String *this_local;
  
  if (other->data->ref == 0) {
    if (other->data == &emptyData.super_Data) {
      this->data = &emptyData.super_Data;
    }
    else {
      uVar3 = other->data->len | 3;
      pDVar4 = (Data *)operator_new__(uVar3 + 0x21);
      this->data = pDVar4;
      this->data->str = (char *)(this->data + 1);
      Memory::copy((Memory *)this->data->str,(EVP_PKEY_CTX *)other->data->str,
                   (EVP_PKEY_CTX *)other->data->len);
      pcVar1 = this->data->str;
      uVar2 = other->data->len;
      this->data->len = uVar2;
      pcVar1[uVar2] = '\0';
      this->data->ref = 1;
      this->data->capacity = uVar3;
    }
  }
  else {
    this->data = other->data;
    Atomic::increment(&this->data->ref);
  }
  return;
}

Assistant:

String(const String& other)
  {
    if(other.data->ref)
    {
      data = other.data;
      Atomic::increment(data->ref);
    }
    else if(other.data == &emptyData)
      data = &emptyData;
    else
    {
      usize capacity = other.data->len | 0x3;
      data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
      data->str = (char*)((byte*)data + sizeof(Data));
      Memory::copy((char*)data->str, other.data->str, other.data->len * sizeof(char));
      ((char*)data->str)[data->len = other.data->len] = '\0';
      data->ref = 1;
      data->capacity = capacity;
    }
  }